

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  mapped_type mVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  ConcatLayerParams *this_00;
  string *psVar4;
  mapped_type *pmVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string err;
  _Self local_f0;
  key_type *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  _Self local_c0;
  mapped_type local_b8;
  allocator<char> local_b1;
  int rank;
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,2,-1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar2 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Concat",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar2,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        this_00 = Specification::NeuralNetworkLayer::concat(local_20);
        bVar3 = Specification::ConcatLayerParams::sequenceconcat(this_00);
        pNVar2 = local_20;
        if (bVar3) {
          local_62 = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Concat",&local_89)
          ;
          validateRankCount(__return_storage_ptr__,pNVar2,&local_88,5,-1,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
          bVar3 = Result::good(__return_storage_ptr__);
          if (!bVar3) {
            local_62 = 1;
          }
          local_38 = (uint)!bVar3;
          if ((local_62 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
        }
        else {
          local_8a = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&rank,"Concat",&local_b1);
          validateRankCount(__return_storage_ptr__,pNVar2,(string *)&rank,3,-1,&this->blobNameToRank
                           );
          std::__cxx11::string::~string((string *)&rank);
          std::allocator<char>::~allocator(&local_b1);
          bVar3 = Result::good(__return_storage_ptr__);
          if (!bVar3) {
            local_8a = 1;
          }
          local_38 = (uint)!bVar3;
          if ((local_8a & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_b8 = 0;
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->blobNameToRank,psVar4);
        __range2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::end(&this->blobNameToRank);
        bVar3 = std::operator!=(&local_c0,(_Self *)&__range2);
        if (!bVar3) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,psVar4);
        local_b8 = *pmVar5;
        this_01 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20);
        __end2 = google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::begin(this_01);
        input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::end(this_01);
        while (bVar3 = google::protobuf::internal::
                       RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator!=(&__end2,(iterator *)&input), bVar3) {
          local_e8 = google::protobuf::internal::
                     RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
          local_f0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,local_e8);
          err.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          bVar3 = std::operator!=(&local_f0,(_Self *)((long)&err.field_2 + 8));
          mVar1 = local_b8;
          if ((bVar3) &&
             (pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at(&this->blobNameToRank,local_e8), mVar1 != *pmVar5)) {
            std::__cxx11::string::string((string *)local_118);
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::__cxx11::string::string((string *)&local_178,(string *)psVar4);
            std::operator+(&local_158,"Layer \'",&local_178);
            std::operator+(&local_138,&local_158,
                           "\' of type \'Concat\' expects equal ranks for its inputs, but they are not equal."
                          );
            std::__cxx11::string::operator=((string *)local_118,(string *)&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_118);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_118);
            return __return_storage_ptr__;
          }
          google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Concat", blobNameToRank));

        if (layer.concat().sequenceconcat()) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 5, -1, blobNameToRank));
        } else {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 3, -1, blobNameToRank));
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return Result();
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}